

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasdreamOptimizationTests.cpp
# Opt level: O2

bool __thiscall DreamExternalTester::testOptimization(DreamExternalTester *this)

{
  bool bVar1;
  bool pass;
  bool bVar2;
  bool pass_00;
  
  bVar1 = TasOptimization::testParticleSwarmState(this->verbose);
  pass = TasOptimization::testParticleSwarm(this->verbose);
  reportPassFail(pass,"Optimization","Particle Swarm");
  bVar2 = TasOptimization::testGradientDescentState(this->verbose);
  pass_00 = TasOptimization::testGradientDescent(this->verbose);
  reportPassFail(pass_00,"Optimization","Gradient Descent");
  return (pass && pass_00) && (bVar2 && bVar1);
}

Assistant:

bool DreamExternalTester::testOptimization(){
    test_result test;

    // Test Particle Swarm State and Algorithm.
    test.tassert(TasOptimization::testParticleSwarmState(verbose));
    test.tassert(TasOptimization::testParticleSwarm(verbose));
    reportPassFail(test.last_success(), "Optimization", "Particle Swarm");

    // Test Gradient Descent State and Algorithm.
    test.tassert(TasOptimization::testGradientDescentState(verbose));
    test.tassert(TasOptimization::testGradientDescent(verbose));
    reportPassFail(test.last_success(), "Optimization", "Gradient Descent");

    return test.success();
}